

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::mirror(CImg<unsigned_char> *this,char axis)

{
  uchar uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uchar *puVar5;
  long lVar6;
  CImgArgumentException *this_00;
  uint uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  size_t __n;
  ulong uVar14;
  ulong uVar15;
  void *local_48;
  
  bVar2 = is_empty(this);
  if (!bVar2) {
    cVar3 = axis + ' ';
    if ((byte)(axis + 0xa5U) < 0xe6) {
      cVar3 = axis;
    }
    if (cVar3 == 'c') {
      uVar8 = (ulong)this->_width;
      uVar15 = (ulong)this->_height;
      uVar14 = (ulong)this->_depth;
      uVar12 = uVar15 * uVar8 * uVar14;
      local_48 = operator_new__(uVar12);
      puVar5 = this->_data;
      puVar9 = puVar5 + (this->_spectrum - 1) * uVar12;
      uVar7 = this->_spectrum >> 1;
      while (bVar2 = uVar7 != 0, uVar7 = uVar7 - 1, bVar2) {
        uVar8 = (ulong)(uint)((int)uVar15 * (int)uVar8 * (int)uVar14);
        memcpy(local_48,puVar5,uVar8);
        memcpy(puVar5,puVar9,uVar8);
        memcpy(puVar9,local_48,(ulong)(this->_height * this->_width * this->_depth));
        uVar8 = (ulong)this->_width;
        uVar15 = (ulong)this->_height;
        uVar14 = (ulong)this->_depth;
        lVar6 = uVar15 * uVar8 * uVar14;
        puVar5 = puVar5 + lVar6;
        puVar9 = puVar9 + -lVar6;
      }
    }
    else if (cVar3 == 'z') {
      uVar8 = (ulong)this->_width;
      uVar12 = (ulong)this->_height;
      local_48 = operator_new__(uVar12 * uVar8);
      puVar5 = this->_data;
      puVar9 = puVar5 + (ulong)(this->_depth - 1) * uVar12 * uVar8;
      uVar7 = this->_depth >> 1;
      for (iVar4 = 0; uVar10 = uVar7, iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        while( true ) {
          if (uVar10 == 0) break;
          uVar8 = (ulong)(uint)((int)uVar12 * (int)uVar8);
          memcpy(local_48,puVar5,uVar8);
          memcpy(puVar5,puVar9,uVar8);
          memcpy(puVar9,local_48,(ulong)(this->_height * this->_width));
          uVar8 = (ulong)this->_width;
          uVar12 = (ulong)this->_height;
          puVar5 = puVar5 + uVar12 * uVar8;
          puVar9 = puVar9 + -(uVar12 * uVar8);
          uVar10 = uVar10 - 1;
        }
        puVar5 = puVar5 + (ulong)(this->_depth - uVar7) * uVar12 * uVar8;
        puVar9 = puVar9 + (ulong)(this->_depth + uVar7) * uVar12 * uVar8;
      }
    }
    else {
      if (cVar3 != 'y') {
        if (cVar3 == 'x') {
          puVar5 = this->_data;
          puVar9 = puVar5 + (this->_width - 1);
          uVar7 = this->_width >> 1;
          for (uVar10 = 0; uVar11 = uVar7, uVar10 < this->_depth * this->_height * this->_spectrum;
              uVar10 = uVar10 + 1) {
            while (uVar11 != 0) {
              uVar1 = *puVar5;
              *puVar5 = *puVar9;
              puVar5 = puVar5 + 1;
              *puVar9 = uVar1;
              puVar9 = puVar9 + -1;
              uVar11 = uVar11 - 1;
            }
            puVar5 = puVar5 + (this->_width - uVar7);
            puVar9 = puVar9 + (this->_width + uVar7);
          }
          return this;
        }
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        pcVar13 = "non-";
        if (this->_is_shared != false) {
          pcVar13 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::mirror(): Invalid specified axis \'%c\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar13,"unsigned char",(ulong)(uint)(int)axis
                  );
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
      }
      __n = (size_t)this->_width;
      local_48 = operator_new__(__n);
      puVar5 = this->_data;
      puVar9 = puVar5 + (this->_height - 1) * __n;
      uVar10 = this->_height >> 1;
      for (uVar7 = 0; uVar11 = uVar10, uVar7 < this->_spectrum * this->_depth; uVar7 = uVar7 + 1) {
        while (uVar11 != 0) {
          memcpy(local_48,puVar5,__n);
          memcpy(puVar5,puVar9,__n);
          memcpy(puVar9,local_48,(ulong)this->_width);
          __n = (size_t)this->_width;
          puVar5 = puVar5 + __n;
          puVar9 = puVar9 + -__n;
          uVar11 = uVar11 - 1;
        }
        puVar5 = puVar5 + (this->_height - uVar10) * __n;
        puVar9 = puVar9 + (this->_height + uVar10) * __n;
      }
    }
    operator_delete__(local_48);
  }
  return this;
}

Assistant:

CImg<T>& mirror(const char axis) {
      if (is_empty()) return *this;
      T *pf, *pb, *buf = 0;
      switch (cimg::lowercase(axis)) {
      case 'x' : {
        pf = _data; pb = data(_width - 1);
        const unsigned int width2 = _width/2;
        for (unsigned int yzv = 0; yzv<_height*_depth*_spectrum; ++yzv) {
          for (unsigned int x = 0; x<width2; ++x) { const T val = *pf; *(pf++) = *pb; *(pb--) = val; }
          pf+=_width - width2;
          pb+=_width + width2;
        }
      } break;
      case 'y' : {
        buf = new T[_width];
        pf = _data; pb = data(0,_height - 1);
        const unsigned int height2 = _height/2;
        for (unsigned int zv = 0; zv<_depth*_spectrum; ++zv) {
          for (unsigned int y = 0; y<height2; ++y) {
            std::memcpy(buf,pf,_width*sizeof(T));
            std::memcpy(pf,pb,_width*sizeof(T));
            std::memcpy(pb,buf,_width*sizeof(T));
            pf+=_width;
            pb-=_width;
          }
          pf+=(ulongT)_width*(_height - height2);
          pb+=(ulongT)_width*(_height + height2);
        }
      } break;
      case 'z' : {
        buf = new T[(ulongT)_width*_height];
        pf = _data; pb = data(0,0,_depth - 1);
        const unsigned int depth2 = _depth/2;
        cimg_forC(*this,c) {
          for (unsigned int z = 0; z<depth2; ++z) {
            std::memcpy(buf,pf,_width*_height*sizeof(T));
            std::memcpy(pf,pb,_width*_height*sizeof(T));
            std::memcpy(pb,buf,_width*_height*sizeof(T));
            pf+=(ulongT)_width*_height;
            pb-=(ulongT)_width*_height;
          }
          pf+=(ulongT)_width*_height*(_depth - depth2);
          pb+=(ulongT)_width*_height*(_depth + depth2);
        }
      } break;
      case 'c' : {
        buf = new T[(ulongT)_width*_height*_depth];
        pf = _data; pb = data(0,0,0,_spectrum - 1);
        const unsigned int _spectrum2 = _spectrum/2;
        for (unsigned int v = 0; v<_spectrum2; ++v) {
          std::memcpy(buf,pf,_width*_height*_depth*sizeof(T));
          std::memcpy(pf,pb,_width*_height*_depth*sizeof(T));
          std::memcpy(pb,buf,_width*_height*_depth*sizeof(T));
          pf+=(ulongT)_width*_height*_depth;
          pb-=(ulongT)_width*_height*_depth;
        }
      } break;
      default :
        throw CImgArgumentException(_cimg_instance
                                    "mirror(): Invalid specified axis '%c'.",
                                    cimg_instance,
                                    axis);
      }
      delete[] buf;
      return *this;
    }